

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O3

void __thiscall cmCTestHandlerCommand::cmCTestHandlerCommand(cmCTestHandlerCommand *this)

{
  pointer *pppcVar1;
  iterator __position;
  long lVar2;
  char *local_38;
  
  (this->super_cmCTestCommand).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (this->super_cmCTestCommand).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(this->super_cmCTestCommand).super_cmCommand.Error.field_2;
  (this->super_cmCTestCommand).super_cmCommand.Error._M_string_length = 0;
  (this->super_cmCTestCommand).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (this->super_cmCTestCommand).CTest = (cmCTest *)0x0;
  (this->super_cmCTestCommand).CTestScriptHandler = (cmCTestScriptHandler *)0x0;
  (this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestHandlerCommand_00781ea8;
  (this->ReturnVariable)._M_dataplus._M_p = (pointer)&(this->ReturnVariable).field_2;
  (this->ReturnVariable)._M_string_length = 0;
  (this->ReturnVariable).field_2._M_local_buf[0] = '\0';
  (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = 100;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve(&this->Arguments,100);
  do {
    local_38 = (char *)0x0;
    __position._M_current =
         (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&this->Arguments,__position,
                 &local_38);
    }
    else {
      *__position._M_current = (char *)0x0;
      pppcVar1 = &(this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start[1] = "RETURN_VALUE";
  (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start[2] = "CAPTURE_CMAKE_ERROR";
  (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start[4] = "SOURCE";
  (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start[3] = "BUILD";
  (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start[5] = "SUBMIT_INDEX";
  this->Last = 6;
  this->AppendXML = false;
  this->Quiet = false;
  return;
}

Assistant:

cmCTestHandlerCommand::cmCTestHandlerCommand()
{
  const size_t INIT_SIZE = 100;
  size_t cc;
  this->Arguments.reserve(INIT_SIZE);
  for (cc = 0; cc < INIT_SIZE; ++cc) {
    this->Arguments.push_back(CM_NULLPTR);
  }
  this->Arguments[ct_RETURN_VALUE] = "RETURN_VALUE";
  this->Arguments[ct_CAPTURE_CMAKE_ERROR] = "CAPTURE_CMAKE_ERROR";
  this->Arguments[ct_SOURCE] = "SOURCE";
  this->Arguments[ct_BUILD] = "BUILD";
  this->Arguments[ct_SUBMIT_INDEX] = "SUBMIT_INDEX";
  this->Last = ct_LAST;
  this->AppendXML = false;
  this->Quiet = false;
}